

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

char * el::base::utils::Str::convertAndAddToBuff
                 (size_t n,int len,char *buf,char *bufLim,bool zeroPadded)

{
  byte bVar1;
  bool bVar2;
  byte *pbVar3;
  byte *pbVar4;
  uint uVar5;
  byte local_20 [7];
  byte abStack_19 [9];
  char localBuff [10];
  
  abStack_19[1] = 0;
  abStack_19[2] = 0;
  if (n == 0) {
    pbVar4 = abStack_19;
    len = len - 1;
  }
  else if (len < 1) {
    pbVar4 = abStack_19 + 1;
  }
  else {
    pbVar3 = abStack_19;
    uVar5 = len;
    do {
      pbVar4 = pbVar3;
      *pbVar4 = (char)n + (char)(n / 10) * -10 | 0x30;
      len = uVar5 - 1;
      if ((n < 10) || (pbVar4 <= local_20)) break;
      bVar2 = 1 < uVar5;
      n = n / 10;
      pbVar3 = pbVar4 + -1;
      uVar5 = len;
    } while (bVar2);
  }
  if (zeroPadded) {
    for (; (local_20 < pbVar4 && (0 < len)); len = len - 1) {
      pbVar4[-1] = 0x30;
      pbVar4 = pbVar4 + -1;
    }
  }
  pbVar3 = (byte *)buf;
  if (buf < bufLim) {
    do {
      bVar1 = *pbVar4;
      *pbVar3 = bVar1;
      if (bVar1 == 0) {
        return (char *)pbVar3;
      }
      pbVar4 = pbVar4 + 1;
      pbVar3 = pbVar3 + 1;
      buf = bufLim;
    } while (pbVar3 != (byte *)bufLim);
  }
  return buf;
}

Assistant:

char* Str::convertAndAddToBuff(std::size_t n, int len, char* buf, const char* bufLim, bool zeroPadded) {
  char localBuff[10] = "";
  char* p = localBuff + sizeof(localBuff) - 2;
  if (n > 0) {
    for (; n > 0 && p > localBuff && len > 0; n /= 10, --len)
      *--p = static_cast<char>(n % 10 + '0');
  } else {
    *--p = '0';
    --len;
  }
  if (zeroPadded)
    while (p > localBuff && len-- > 0) *--p = static_cast<char>('0');
  return addToBuff(p, buf, bufLim);
}